

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSliceLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  string *psVar5;
  pointer pcVar6;
  ActivationLinear *pAVar7;
  ulong uVar8;
  bool bVar9;
  LogMessage *other;
  long *plVar10;
  LayerUnion LVar11;
  size_type *psVar12;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((this->ndArrayInterpretation != true) ||
     ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_002fa359;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Slice","");
  validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar9 = Result::good(__return_storage_ptr__);
  if (!bVar9) {
    return __return_storage_ptr__;
  }
  pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_c8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_e8,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_c8);
  }
  iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24
                  );
  pcVar4 = local_c8 + 0x10;
  local_c8._8_8_ = (char *)0x0;
  local_c8._16_8_ = local_c8._16_8_ & 0xffffffffffffff00;
  local_c8._0_8_ = pcVar4;
  if (layer->_oneof_case_[0] == 0x15e) {
    LVar11 = layer->layer_;
  }
  else {
    LVar11.slice_ = Specification::SliceLayerParams::default_instance();
  }
  iVar3 = ((LVar11.convolution_)->stride_).current_size_;
  if (iVar3 == 0) {
    bVar9 = true;
    if (iVar2 < 3) {
LAB_002fa1f1:
      psVar5 = (layer->name_).ptr_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar6,pcVar6 + psVar5->_M_string_length);
      std::operator+(&local_70,"Slice layer \'",&local_90);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
LAB_002fa283:
      psVar12 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_e8.field_2._M_allocated_capacity = *psVar12;
        local_e8.field_2._8_8_ = plVar10[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar12;
        local_e8._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_e8._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_c8,(string *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
      bVar9 = false;
    }
  }
  else if (iVar3 == 1) {
    bVar9 = true;
    if (iVar2 < 2) goto LAB_002fa1f1;
  }
  else {
    if (iVar3 != 2) {
      psVar5 = (layer->name_).ptr_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar6 = (psVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar6,pcVar6 + psVar5->_M_string_length);
      std::operator+(&local_70,"Slice layer: \'",&local_90);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
      goto LAB_002fa283;
    }
    bVar9 = true;
    if (iVar2 < 1) goto LAB_002fa1f1;
  }
  if ((pointer)local_c8._0_8_ != pcVar4) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (!bVar9) {
    return __return_storage_ptr__;
  }
LAB_002fa359:
  if (layer->_oneof_case_[0] == 0x15e) {
    LVar11 = layer->layer_;
  }
  else {
    LVar11.slice_ = Specification::SliceLayerParams::default_instance();
  }
  if ((int)*(uint64 *)&(LVar11.convolution_)->_kernelsize_cached_byte_size_ < 1) {
    std::operator+(&local_e8,"Stride length for the slice layer \'",(layer->name_).ptr_);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_c8._0_8_ = local_c8 + 0x10;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar12) {
      local_c8._16_8_ = *psVar12;
      local_c8._24_8_ = plVar10[3];
    }
    else {
      local_c8._16_8_ = *psVar12;
      local_c8._0_8_ = (size_type *)*plVar10;
    }
    local_c8._8_8_ = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
  }
  else {
    pAVar7 = ((LVar11.activation_)->NonlinearityType_).linear_;
    uVar8 = (LVar11.slice_)->endindex_;
    if (((long)uVar8 < 1 || (long)pAVar7 <= (long)uVar8) &&
       (-1 < (long)(uVar8 & (ulong)pAVar7) || (long)pAVar7 <= (long)uVar8)) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_e8,"Slice layer ",(layer->name_).ptr_);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_c8._0_8_ = local_c8 + 0x10;
    psVar12 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar12) {
      local_c8._16_8_ = *psVar12;
      local_c8._24_8_ = plVar10[3];
    }
    else {
      local_c8._16_8_ = *psVar12;
      local_c8._0_8_ = (size_type *)*plVar10;
    }
    local_c8._8_8_ = plVar10[1];
    *plVar10 = (long)psVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_c8);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSliceLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation && layer.inputtensor_size() > 0) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Slice", blobNameToRank));
        int rank = static_cast<int>(layer.inputtensor(0).rank());
        bool sufficientInputRank = true;
        std::string err;

        switch (layer.slice().axis()) {
            case Specification::SliceLayerParams_SliceAxis_CHANNEL_AXIS:
                if (rank < 3) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_HEIGHT_AXIS:
                if (rank < 2) {sufficientInputRank = false;}
                break;
            case Specification::SliceLayerParams_SliceAxis_WIDTH_AXIS:
                if (rank < 1) {sufficientInputRank = false;}
                break;
            default:
                err = "Slice layer: '" + std::string(layer.name()) + "': unknown value for parameter 'axis'.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!sufficientInputRank) {
            err = "Slice layer '" + std::string(layer.name()) + "': input's rank is smaller than the dimension provided in the axis parameter";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    const auto& slice = layer.slice();
    int stride = static_cast<int>(slice.stride());
    if (stride < 1) {
        std::string err = "Stride length for the slice layer '" + layer.name() + "' must be > 1.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    int64_t start = (int64_t)slice.startindex();
    int64_t end = slice.endindex();
    if ((end > 0 && end < start )
        || (end < 0 && start < 0 && start > end)) {
        std::string err = "Slice layer " + layer.name() + " has an end index before the start index.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}